

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_maximal_dimension<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>
               (Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>
                *m)

{
  Underlying_matrix *this;
  Pos_index PVar1;
  Index IVar2;
  Index IVar3;
  Pos_index index;
  uint eventIndex;
  undefined4 local_138;
  int local_134;
  undefined1 *local_130;
  int *local_128;
  undefined1 local_120 [8];
  undefined8 local_118;
  shared_count sStack_110;
  initializer_list<unsigned_int> local_108;
  undefined8 *local_f8;
  int **local_f0;
  initializer_list<unsigned_int> local_e8;
  undefined8 *local_d8;
  undefined1 **local_d0;
  char *local_c0;
  char *local_b8;
  undefined **local_b0;
  undefined1 local_a8;
  undefined8 *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x39f);
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_00239238;
  local_a0 = &boost::unit_test::lazy_ostream::inst;
  local_98 = "";
  local_134 = (m->matrix_).reducedMatrixR_.super_Matrix_dimension_option.maxDim_;
  local_128 = &local_134;
  local_138 = 2;
  local_120[0] = local_134 == 2;
  local_118 = 0;
  sStack_110.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_f0 = &local_128;
  local_108._M_len = local_108._M_len & 0xffffffffffffff00;
  local_108._M_array = (iterator)&PTR__lazy_ostream_002391f8;
  local_f8 = &boost::unit_test::lazy_ostream::inst;
  local_e8._M_len = local_e8._M_len & 0xffffffffffffff00;
  local_d0 = &local_130;
  local_e8._M_array = (iterator)&PTR__lazy_ostream_002391f8;
  local_d8 = &boost::unit_test::lazy_ostream::inst;
  local_130 = (undefined1 *)&local_138;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_110);
  local_108._M_array = (iterator)0x100000000;
  local_108._M_len = 0x300000002;
  local_f8 = (undefined8 *)0x500000004;
  local_e8._M_len = 6;
  this = &m->matrix_;
  local_e8._M_array = (iterator)&local_108;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>
              *)this,&local_e8,-1);
  local_e8._M_array = (iterator)0x100000000;
  local_e8._M_len = 0x300000002;
  local_108._M_len = 4;
  local_108._M_array = (iterator)&local_e8;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>
              *)this,&local_108,-1);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x3a9);
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_00239238;
  local_a0 = &boost::unit_test::lazy_ostream::inst;
  local_98 = "";
  local_134 = (m->matrix_).reducedMatrixR_.super_Matrix_dimension_option.maxDim_;
  local_120[0] = local_134 == 5;
  local_118 = 0;
  sStack_110.pi_ = (sp_counted_base *)0x0;
  local_138 = 5;
  local_108._M_len = local_108._M_len & 0xffffffffffffff00;
  local_e8._M_len = local_e8._M_len & 0xffffffffffffff00;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_128 = &local_134;
  local_108._M_array = (iterator)&PTR__lazy_ostream_002391f8;
  local_f8 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_128;
  local_e8._M_array = (iterator)&PTR__lazy_ostream_002391f8;
  local_d8 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_130;
  local_130 = (undefined1 *)&local_138;
  boost::test_tools::tt_detail::report_assertion
            (local_120,&local_b0,&local_c0,0x3a9,1,2,2,"m.get_max_dimension()",&local_108,"5",
             &local_e8);
  boost::detail::shared_count::~shared_count(&sStack_110);
  eventIndex = (m->matrix_).nextEventIndex_ - 1;
  if (7 < eventIndex) {
    index = 7;
    do {
      Gudhi::persistence_matrix::
      RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
      ::vine_swap(&this->super_RU_vine_swap_option,index);
      index = index + 1;
      PVar1 = (m->matrix_).nextEventIndex_;
      eventIndex = PVar1 - 1;
    } while (index < eventIndex);
    if (PVar1 == 0) goto LAB_0015b2ad;
  }
  (m->matrix_).nextEventIndex_ = eventIndex;
  Gudhi::persistence_matrix::
  RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
  ::_remove_last((RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
                  *)this,eventIndex);
  IVar2 = (m->matrix_).mirrorMatrixU_.nextInsertIndex_;
  if (IVar2 != 0) {
    (m->matrix_).mirrorMatrixU_.nextInsertIndex_ = IVar2 - 1;
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(m->matrix_).mirrorMatrixU_.matrix_._M_h,
               &(m->matrix_).mirrorMatrixU_.nextInsertIndex_);
  }
  IVar3 = Gudhi::persistence_matrix::
          Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
          ::remove_last(&(m->matrix_).reducedMatrixR_);
  local_108._M_array = (iterator)CONCAT44(local_108._M_array._4_4_,IVar3);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(m->matrix_).pivotToColumnIndex_._M_h);
LAB_0015b2ad:
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x3af);
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_00239238;
  local_a0 = &boost::unit_test::lazy_ostream::inst;
  local_98 = "";
  local_134 = (m->matrix_).reducedMatrixR_.super_Matrix_dimension_option.maxDim_;
  local_120[0] = local_134 == 3;
  local_138 = 3;
  local_118 = 0;
  sStack_110.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_128 = &local_134;
  local_108._M_len = local_108._M_len & 0xffffffffffffff00;
  local_108._M_array = (iterator)&PTR__lazy_ostream_002391f8;
  local_f8 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_128;
  local_e8._M_len = local_e8._M_len & 0xffffffffffffff00;
  local_e8._M_array = (iterator)&PTR__lazy_ostream_002391f8;
  local_d8 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_130;
  local_130 = (undefined1 *)&local_138;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_110);
  return;
}

Assistant:

void test_maximal_dimension(Matrix& m) {
  BOOST_CHECK_EQUAL(m.get_max_dimension(), 2);

  if constexpr (Matrix::Option_list::is_z2) {
    m.insert_boundary({0, 1, 2, 3, 4, 5});
    m.insert_boundary({0, 1, 2, 3});
  } else {
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}, {4, 1}, {5, 4}});
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}});
  }

  BOOST_CHECK_EQUAL(m.get_max_dimension(), 5);

  if constexpr (Matrix::Option_list::has_vine_update &&
                (Matrix::Option_list::is_of_boundary_type ||
                 (Matrix::Option_list::has_map_column_container && Matrix::Option_list::has_column_pairings))) {
    m.remove_maximal_cell(7);
    BOOST_CHECK_EQUAL(m.get_max_dimension(), 3);
  }
}